

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O3

apx_error_t apx_nodeInstance_vfile_open_notify(void *arg,apx_file_t *file)

{
  apx_fileType_t aVar1;
  uint32_t address;
  apx_size_t aVar2;
  apx_error_t aVar3;
  apx_fileManager_tag *file_manager;
  uint8_t *puVar4;
  
  aVar3 = 0x24;
  if ((arg != (void *)0x0 && file != (apx_file_t *)0x0) && (*(long *)((long)arg + 0x50) != 0)) {
    file_manager = apx_file_get_file_manager(file);
    if (file_manager != (apx_fileManager_tag *)0x0) {
      aVar1 = apx_file_get_apx_file_type(file);
      address = apx_file_get_address_without_flags(file);
      if (aVar1 == '\x03') {
        aVar3 = 0;
        if (*(char *)((long)arg + 0x78) == '\x02') {
          if (*(apx_server_t **)((long)arg + 0x88) == (apx_server_t *)0x0) {
            *(undefined1 *)((long)arg + 0x7a) = 4;
            aVar3 = send_require_port_data_to_file_manager
                              ((apx_nodeInstance_t *)arg,file_manager,address);
            return aVar3;
          }
          apx_server_take_global_lock(*(apx_server_t **)((long)arg + 0x88));
          aVar3 = connect_require_ports_to_server((apx_nodeInstance_t *)arg);
          if (aVar3 == 0) {
            *(undefined1 *)((long)arg + 0x7a) = 4;
            aVar3 = send_require_port_data_to_file_manager
                              ((apx_nodeInstance_t *)arg,file_manager,address);
          }
          apx_server_release_global_lock(*(apx_server_t **)((long)arg + 0x88));
        }
      }
      else if (aVar1 == '\x02') {
        puVar4 = apx_nodeData_take_provide_port_data_snapshot
                           (*(apx_nodeData_t **)((long)arg + 0x50));
        aVar2 = apx_nodeData_provide_port_data_size(*(apx_nodeData_t **)((long)arg + 0x50));
        if (puVar4 != (uint8_t *)0x0) {
          aVar3 = apx_fileManager_send_local_data(file_manager,address,puVar4,aVar2);
          return aVar3;
        }
        aVar3 = 2;
      }
      else {
        aVar3 = 10;
        if (aVar1 == '\x01') {
          puVar4 = apx_nodeData_get_definition_data(*(apx_nodeData_t **)((long)arg + 0x50));
          aVar2 = apx_nodeData_definition_data_size(*(apx_nodeData_t **)((long)arg + 0x50));
          aVar3 = apx_fileManager_send_local_const_data(file_manager,address,puVar4,aVar2);
          return aVar3;
        }
      }
    }
  }
  return aVar3;
}

Assistant:

static apx_error_t file_open_notify(apx_nodeInstance_t* self, apx_file_t* file)
{
   if ( (file != NULL) && (self != NULL) && (self->node_data != NULL) )
   {
      apx_fileManager_t* file_manager = apx_file_get_file_manager(file);
      if (file_manager != NULL)
      {
         apx_error_t retval = APX_NO_ERROR;
         apx_fileType_t file_type = apx_file_get_apx_file_type(file);
         uint32_t address = apx_file_get_address_without_flags(file);
         switch (file_type)
         {
         case APX_DEFINITION_FILE_TYPE:
            retval = send_definition_data_to_file_manager(self, file_manager, address);
            break;
         case APX_PROVIDE_PORT_DATA_FILE_TYPE:
            retval = send_provide_port_data_to_file_manager(self, file_manager, address);
            break;
         case APX_REQUIRE_PORT_DATA_FILE_TYPE:
            if (self->mode == APX_SERVER_MODE)
            {
               if (self->server != NULL)
               {
                  apx_server_take_global_lock(self->server);
                  retval = connect_require_ports_to_server(self);
                  if (retval == APX_NO_ERROR)
                  {
                     apx_nodeInstance_set_require_port_data_state(self, APX_DATA_STATE_CONNECTED);
                     //TODO:Take snapshot first, then release global lock, then transmit snapshot data through file manager.
                     //This shortens the time the global lock is held.
                     retval = send_require_port_data_to_file_manager(self, file_manager, address);
                  }
                  apx_server_release_global_lock(self->server);
               }
               else
               {
                  apx_nodeInstance_set_require_port_data_state(self, APX_DATA_STATE_CONNECTED);
                  retval = send_require_port_data_to_file_manager(self, file_manager, address);
               }
            }
            break;
         default:
            retval = APX_UNSUPPORTED_ERROR;
         }
         return retval;
      }
   }
   return APX_NULL_PTR_ERROR;
}